

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O2

void __thiscall CholeskyFactor::recompute(CholeskyFactor *this)

{
  Basis *this_00;
  pointer pdVar1;
  MatrixBase *this_01;
  QpVector *rhs;
  ulong uVar2;
  long lVar3;
  double *pdVar4;
  HighsInt i;
  int col_00;
  long lVar5;
  pointer pdVar6;
  ulong uVar7;
  size_t col;
  ulong uVar8;
  long lVar9;
  int new_k_max;
  size_t row;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  orig;
  QpVector buffer_ZtQi;
  Matrix temp;
  QpVector buffer_Qcol;
  
  orig.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  orig.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  orig.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar10 = (ulong)((long)(this->basis->non_active_constraint_index).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->basis->non_active_constraint_index).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  this->numberofreduces = 0;
  new_k_max = (int)uVar10;
  buffer_Qcol.num_nz = 0;
  buffer_Qcol.dim = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&temp,(long)new_k_max,
             (value_type_conflict1 *)&buffer_Qcol,(allocator_type *)&buffer_ZtQi);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::_M_fill_assign(&orig,(long)new_k_max,(value_type *)&temp);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&temp);
  resize(this,new_k_max);
  temp.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  temp.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  temp.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  temp.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  temp.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  temp.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  temp.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  temp.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  temp.mat.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  temp.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  temp.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  temp.tran.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  temp.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  temp.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  temp.tran.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  temp.tran.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  temp.tran.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  temp.tran.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  temp.tran.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  temp._73_8_ = 0;
  temp.mat.num_col = 0;
  temp.mat.num_row = new_k_max;
  QpVector::QpVector(&buffer_Qcol,(this->runtime->instance).num_var);
  QpVector::QpVector(&buffer_ZtQi,new_k_max);
  for (col_00 = 0; col_00 < (this->runtime->instance).num_var; col_00 = col_00 + 1) {
    MatrixBase::extractcol(&(this->runtime->instance).Q.mat,col_00,&buffer_Qcol);
    Basis::Ztprod(this->basis,&buffer_Qcol,&buffer_ZtQi,false,-1);
    Matrix::append(&temp,&buffer_ZtQi);
  }
  this_01 = Matrix::t(&temp);
  uVar8 = 0;
  if (0 < new_k_max) {
    uVar8 = uVar10 & 0xffffffff;
  }
  for (uVar10 = 0; uVar10 != uVar8; uVar10 = uVar10 + 1) {
    this_00 = this->basis;
    rhs = MatrixBase::extractcol(this_01,(HighsInt)uVar10,&buffer_Qcol);
    Basis::Ztprod(this_00,rhs,&buffer_ZtQi,false,-1);
    uVar2 = (ulong)(uint)buffer_ZtQi.num_nz;
    if (buffer_ZtQi.num_nz < 1) {
      uVar2 = 0;
    }
    for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
      orig.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar10].
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [buffer_ZtQi.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[uVar7]] =
           buffer_ZtQi.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start
           [buffer_ZtQi.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7]];
    }
  }
  lVar9 = 0;
  for (uVar10 = 0;
      uVar10 < (ulong)(((long)orig.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)orig.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar10 = uVar10 + 1
      ) {
    lVar5 = 0;
    for (uVar8 = 0; uVar8 <= uVar10; uVar8 = uVar8 + 1) {
      lVar3 = (long)this->current_k_max;
      pdVar1 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar8 == uVar10) {
        pdVar4 = (double *)((long)pdVar1 + lVar9);
        dVar12 = 0.0;
        uVar2 = uVar10;
        while (bVar11 = uVar2 != 0, uVar2 = uVar2 - 1, bVar11) {
          dVar12 = dVar12 + *pdVar4 * *pdVar4;
          pdVar4 = pdVar4 + lVar3;
        }
        dVar12 = orig.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar10].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar10] - dVar12;
        if (dVar12 < 0.0) {
          dVar12 = sqrt(dVar12);
        }
        else {
          dVar12 = SQRT(dVar12);
        }
        (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[((long)this->current_k_max + 1) * uVar10] = dVar12;
      }
      else {
        dVar12 = 0.0;
        pdVar6 = pdVar1;
        uVar2 = uVar8;
        while (bVar11 = uVar2 != 0, uVar2 = uVar2 - 1, bVar11) {
          dVar12 = dVar12 + *(double *)((long)pdVar6 + lVar9) * *(double *)((long)pdVar6 + lVar5);
          pdVar6 = pdVar6 + lVar3;
        }
        pdVar1[lVar3 * uVar8 + uVar10] =
             (orig.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar10].
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar8] - dVar12) / pdVar1[(lVar3 + 1) * uVar8];
      }
      lVar5 = lVar5 + 8;
    }
    lVar9 = lVar9 + 8;
  }
  this->current_k = new_k_max;
  this->uptodate = true;
  QpVector::~QpVector(&buffer_ZtQi);
  QpVector::~QpVector(&buffer_Qcol);
  Matrix::~Matrix(&temp);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&orig);
  return;
}

Assistant:

void recompute() {
    std::vector<std::vector<double>> orig;
    HighsInt dim_ns = basis.getinactive().size();
    numberofreduces = 0;

    orig.assign(dim_ns, std::vector<double>(dim_ns, 0.0));
    resize(dim_ns);

    Matrix temp(dim_ns, 0);

    QpVector buffer_Qcol(runtime.instance.num_var);
    QpVector buffer_ZtQi(dim_ns);
    for (HighsInt i = 0; i < runtime.instance.num_var; i++) {
      runtime.instance.Q.mat.extractcol(i, buffer_Qcol);
      basis.Ztprod(buffer_Qcol, buffer_ZtQi);
      temp.append(buffer_ZtQi);
    }
    MatrixBase& temp_t = temp.t();
    for (HighsInt i = 0; i < dim_ns; i++) {
      basis.Ztprod(temp_t.extractcol(i, buffer_Qcol), buffer_ZtQi);
      for (HighsInt j = 0; j < buffer_ZtQi.num_nz; j++) {
        orig[i][buffer_ZtQi.index[j]] = buffer_ZtQi.value[buffer_ZtQi.index[j]];
      }
    }

    for (size_t col = 0; col < orig.size(); col++) {
      for (size_t row = 0; row <= col; row++) {
        double sum = 0;
        if (row == col) {
          for (size_t k = 0; k < row; k++)
            sum += L[k * current_k_max + row] * L[k * current_k_max + row];
          L[row * current_k_max + row] = sqrt(orig[row][row] - sum);
        } else {
          for (size_t k = 0; k < row; k++)
            sum += (L[k * current_k_max + col] * L[k * current_k_max + row]);
          L[row * current_k_max + col] =
              (orig[col][row] - sum) / L[row * current_k_max + row];
        }
      }
    }
    current_k = dim_ns;
    uptodate = true;
  }